

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lennard.c
# Opt level: O1

void computeProperties(int natoms,double potentialEnergy,double *totalEnergy)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double vir;
  double kineticEnergy;
  double *a;
  double *x;
  double *v;
  int ld;
  int hi;
  int lo;
  double local_68;
  double local_60;
  double local_58;
  long local_50;
  long local_48;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  
  local_60 = 0.0;
  local_68 = 0.0;
  local_58 = potentialEnergy;
  GA_Sync();
  NGA_Distribution(g_V,gMe,&local_2c,&local_30);
  NGA_Access(g_V,&local_2c,&local_30,&local_40,&local_34);
  NGA_Access(g_X,&local_2c,&local_30,&local_48,&local_34);
  NGA_Access(g_G,&local_2c,&local_30,&local_50,&local_34);
  uVar2 = (local_30 - local_2c) + 1;
  if (2 < (int)uVar2) {
    uVar3 = 0;
    do {
      lVar4 = 0;
      do {
        dVar1 = *(double *)(local_40 + lVar4 * 8);
        local_60 = local_60 + dVar1 * 0.5 * dVar1;
        local_68 = local_68 + *(double *)(local_48 + lVar4 * 8) * *(double *)(local_50 + lVar4 * 8);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      uVar3 = uVar3 + 1;
      local_50 = local_50 + 0x18;
      local_48 = local_48 + 0x18;
      local_40 = local_40 + 0x18;
    } while (uVar3 != (ulong)uVar2 / 3);
  }
  GA_Dgop(&local_60,1,"+");
  GA_Dgop(&local_68,1,"+");
  dVar5 = local_60 + local_58;
  *totalEnergy = dVar5;
  auVar7._0_8_ = local_60 + local_60;
  dVar1 = (double)natoms;
  auVar7._8_8_ = local_68;
  auVar7 = divpd(auVar7,_DAT_001b1040);
  auVar8._8_4_ = SUB84(dVar1,0);
  auVar8._0_8_ = dVar1;
  auVar8._12_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar8 = divpd(auVar7,auVar8);
  dVar6 = auVar8._0_8_;
  dVar1 = (auVar8._8_8_ + dVar6) * gDensity;
  measurementStep = measurementStep + 1;
  temperatureSum = temperatureSum + dVar6;
  temperatureSqdSum = dVar6 * dVar6 + temperatureSqdSum;
  pressureSum = pressureSum + dVar1;
  pressureSqdSum = dVar1 * dVar1 + pressureSqdSum;
  potentialEnergySum = potentialEnergySum + local_58;
  potentialEnergySqdSum = local_58 * local_58 + potentialEnergySqdSum;
  kineticEnergySum = local_60 + kineticEnergySum;
  totalEnergySum = totalEnergySum + dVar5;
  totalEnergySqdSum = dVar5 * dVar5 + totalEnergySqdSum;
  return;
}

Assistant:

void computeProperties(int natoms, double potentialEnergy, 
               double *totalEnergy) {
  
  int i, p, lo, hi, ld, natms;
  double kineticEnergy = 0.0, vir = 0.0;
  double *v, *x, *a;
  
  GA_Sync();
  
  NGA_Distribution(g_V, gMe, &lo, &hi);
  NGA_Access(g_V, &lo, &hi, &v, &ld);
  NGA_Access(g_X, &lo, &hi, &x, &ld);
  NGA_Access(g_G, &lo, &hi, &a, &ld);
  
  natms = (hi-lo+1)/NDIM;
  for (p = 0; p < natms; p++)
    for (i = 0; i < NDIM; i++) {
      kineticEnergy += 0.5 * v[p*NDIM + i] * v[p*NDIM + i];
      vir += x[p*NDIM + i] * a[p*NDIM + i];
    }

  GA_Dgop(&kineticEnergy, 1, "+");
  GA_Dgop(&vir, 1, "+");
  (*totalEnergy) = kineticEnergy + potentialEnergy;

  temperature = 2.0 * kineticEnergy / 3.0 / natoms;
  pressure = temperature + vir / 3.0 / natoms;
  pressure *= gDensity;

  ++measurementStep;
  temperatureSum += temperature;
  temperatureSqdSum += temperature * temperature;
  pressureSum += pressure;
  pressureSqdSum += pressure * pressure;
  potentialEnergySum += potentialEnergy;
  potentialEnergySqdSum += potentialEnergy * potentialEnergy;

  /* for checking the fluctuation */
  kineticEnergySum += kineticEnergy;
  totalEnergySum   += (*totalEnergy);
  totalEnergySqdSum += (*totalEnergy)*(*totalEnergy);
}